

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

Availability __thiscall
miniscript::Node<CPubKey>::Satisfy<WshSatisfier>
          (Node<CPubKey> *this,WshSatisfier *ctx,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *stack,bool nonmalleable)

{
  long lVar1;
  undefined1 in_CL;
  Node<CPubKey> *in_RDX;
  long in_FS_OFFSET;
  InputResult ret;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined3 in_stack_ffffffffffffff84;
  uint uVar2;
  undefined4 local_5c;
  undefined4 local_30;
  undefined1 local_2c;
  undefined1 local_2b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffff84) & 0x1ffffff;
  ProduceInput<WshSatisfier>
            (in_RDX,(WshSatisfier *)
                    (CONCAT44(CONCAT13(in_CL,in_stack_ffffffffffffff84),in_stack_ffffffffffffff80) &
                    0x1ffffffffffffff));
  if (((uVar2 & 0x1000000) == 0) || (((local_2b & 1) == 0 && ((local_2c & 1) != 0)))) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_RDX,
                (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)CONCAT44(uVar2,in_stack_ffffffffffffff80));
    local_5c = local_30;
  }
  else {
    local_5c = NO;
  }
  miniscript::internal::InputResult::~InputResult
            ((InputResult *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_5c;
  }
  __stack_chk_fail();
}

Assistant:

Availability Satisfy(const Ctx& ctx, std::vector<std::vector<unsigned char>>& stack, bool nonmalleable = true) const {
        auto ret = ProduceInput(ctx);
        if (nonmalleable && (ret.sat.malleable || !ret.sat.has_sig)) return Availability::NO;
        stack = std::move(ret.sat.stack);
        return ret.sat.available;
    }